

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndFrame(void)

{
  int *piVar1;
  ImVec2 IVar2;
  uint uVar3;
  _func_void_int_int *p_Var4;
  char *__s1;
  ImGuiWindow **ppIVar5;
  unsigned_short *puVar6;
  bool bVar7;
  ImVec2 IVar8;
  ImGuiContext *pIVar9;
  ImGuiContext *pIVar10;
  ImU32 key;
  ImVec2 in_RAX;
  ImGuiWindow *pIVar11;
  ImGuiWindow **ppIVar12;
  unsigned_short *__dest;
  byte bVar13;
  char *pcVar14;
  char *label;
  long lVar15;
  byte bVar16;
  int iVar17;
  ImGuiContext *g;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  ImVec2 local_38;
  
  pIVar10 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x100d,"void ImGui::EndFrame()");
  }
  if (GImGui->FrameCountEnded == GImGui->FrameCount) {
    return;
  }
  if (GImGui->FrameScopeActive == false) {
    __assert_fail("g.FrameScopeActive && \"Forgot to call ImGui::NewFrame()?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x1010,"void ImGui::EndFrame()");
  }
  p_Var4 = (GImGui->IO).ImeSetInputScreenPosFn;
  local_38 = in_RAX;
  if (p_Var4 != (_func_void_int_int *)0x0) {
    fVar20 = (GImGui->PlatformImeLastPos).x;
    if ((fVar20 != 3.4028235e+38) || (NAN(fVar20))) {
      fVar21 = (GImGui->PlatformImePos).x;
      fVar22 = (GImGui->PlatformImePos).y;
      fVar23 = (GImGui->PlatformImeLastPos).y - fVar22;
      if ((fVar20 - fVar21) * (fVar20 - fVar21) + fVar23 * fVar23 <= 0.0001) goto LAB_00142db7;
    }
    else {
      fVar21 = (GImGui->PlatformImePos).x;
      fVar22 = (GImGui->PlatformImePos).y;
    }
    (*p_Var4)((int)fVar21,(int)fVar22);
    pIVar10->PlatformImeLastPos = pIVar10->PlatformImePos;
  }
LAB_00142db7:
  iVar17 = (pIVar10->CurrentWindowStack).Size;
  if (iVar17 != 1) {
    if (1 < iVar17) {
      __assert_fail("g.CurrentWindowStack.Size == 1 && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x101f,"void ImGui::EndFrame()");
    }
    __assert_fail("g.CurrentWindowStack.Size == 1 && \"Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x1025,"void ImGui::EndFrame()");
  }
  pIVar10->FrameScopePushedImplicitWindow = false;
  pIVar11 = pIVar10->CurrentWindow;
  if ((pIVar11 != (ImGuiWindow *)0x0) && (pIVar11->WriteAccessed == false)) {
    pIVar11->Active = false;
  }
  End();
  pIVar9 = GImGui;
  if (pIVar10->NavWindowingTarget != (ImGuiWindow *)0x0) {
    if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindowingTarget != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x221f,"void ImGui::NavUpdateWindowingList()");
    }
    if (0.15 < GImGui->NavWindowingTimer || GImGui->NavWindowingTimer == 0.15) {
      if (GImGui->NavWindowingList == (ImGuiWindow *)0x0) {
        key = ImHashStr("###NavWindowingList",0,0);
        pIVar11 = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&pIVar9->WindowsById,key);
        pIVar9->NavWindowingList = pIVar11;
      }
      IVar2 = (pIVar9->IO).DisplaySize;
      fVar20 = IVar2.x;
      fVar21 = IVar2.y;
      IVar8.y = fVar21 * 0.2;
      IVar8.x = fVar20 * 0.2;
      (pIVar9->NextWindowData).SizeConstraintRect.Min = IVar8;
      (pIVar9->NextWindowData).SizeConstraintRect.Max.x = 3.4028235e+38;
      (pIVar9->NextWindowData).SizeConstraintRect.Max.y = 3.4028235e+38;
      (pIVar9->NextWindowData).SizeCallback = (ImGuiSizeCallback)0x0;
      (pIVar9->NextWindowData).SizeCallbackUserData = (void *)0x0;
      *(byte *)&(pIVar9->NextWindowData).Flags = (byte)(pIVar9->NextWindowData).Flags | 0x11;
      IVar2.y = fVar21 * 0.5;
      IVar2.x = fVar20 * 0.5;
      (pIVar9->NextWindowData).PosVal = IVar2;
      (pIVar9->NextWindowData).PosPivotVal.x = 0.5;
      (pIVar9->NextWindowData).PosPivotVal.y = 0.5;
      (pIVar9->NextWindowData).PosCond = 1;
      IVar2 = (pIVar9->Style).WindowPadding;
      fVar20 = IVar2.x;
      fVar21 = IVar2.y;
      local_38.y = fVar21 + fVar21;
      local_38.x = fVar20 + fVar20;
      PushStyleVar(1,&local_38);
      Begin("###NavWindowingList",(bool *)0x0,0xc1347);
      lVar15 = (long)(pIVar9->WindowsFocusOrder).Size;
      if (0 < lVar15) {
        do {
          if ((pIVar9->WindowsFocusOrder).Size < lVar15) goto LAB_0014334e;
          pIVar11 = (pIVar9->WindowsFocusOrder).Data[lVar15 + -1];
          if (((pIVar11->Active == true) && (pIVar11->RootWindow == pIVar11)) &&
             (uVar3 = pIVar11->Flags, (uVar3 >> 0x13 & 1) == 0)) {
            __s1 = pIVar11->Name;
            pcVar14 = __s1;
            if (__s1 == (char *)0xffffffffffffffff) {
LAB_00142f76:
              label = "(Popup)";
              if ((uVar3 >> 0x1a & 1) == 0) {
                if ((uVar3 >> 10 & 1) != 0) {
                  iVar17 = strcmp(__s1,"##MainMenuBar");
                  label = "(Main menu bar)";
                  if (iVar17 == 0) goto LAB_00142fa7;
                }
                label = "(Untitled)";
              }
            }
            else {
              do {
                if (*pcVar14 == '#') {
                  if (pcVar14[1] == '#') goto LAB_00142f6c;
                }
                else if (*pcVar14 == '\0') goto LAB_00142f6c;
                pcVar14 = pcVar14 + 1;
              } while (pcVar14 != (char *)0xffffffffffffffff);
              pcVar14 = (char *)0xffffffffffffffff;
LAB_00142f6c:
              label = __s1;
              if (__s1 == pcVar14) goto LAB_00142f76;
            }
LAB_00142fa7:
            local_38.x = 0.0;
            local_38.y = 0.0;
            Selectable(label,pIVar9->NavWindowingTarget == pIVar11,0,&local_38);
          }
          bVar7 = 1 < lVar15;
          lVar15 = lVar15 + -1;
        } while (bVar7);
      }
      End();
      PopStyleVar(1);
    }
  }
  bVar13 = pIVar10->DragDropActive;
  iVar17 = pIVar10->FrameCount;
  if ((bool)bVar13 != true) goto LAB_00143054;
  if ((pIVar10->DragDropPayload).DataFrameCount + 1 < iVar17) {
    if ((pIVar10->DragDropSourceFlags & 0x20) == 0) {
      if (4 < (ulong)(uint)pIVar10->DragDropMouseButton) {
        __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown)/sizeof(*g.IO.MouseDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x1126,"bool ImGui::IsMouseDown(int)");
      }
      bVar16 = (GImGui->IO).MouseDown[(uint)pIVar10->DragDropMouseButton] ^ 1;
      goto LAB_00143038;
    }
  }
  else {
    bVar16 = 0;
LAB_00143038:
    if ((bVar16 == 0) && ((pIVar10->DragDropPayload).Delivery == false)) goto LAB_00143054;
  }
  ClearDragDrop();
  bVar13 = pIVar10->DragDropActive;
  iVar17 = pIVar10->FrameCount;
LAB_00143054:
  if (((bVar13 & 1) != 0) && (pIVar10->DragDropSourceFrameCount < iVar17)) {
    pIVar10->DragDropWithinSourceOrTarget = true;
    SetTooltip("...");
    pIVar10->DragDropWithinSourceOrTarget = false;
    iVar17 = pIVar10->FrameCount;
  }
  pIVar10->FrameScopeActive = false;
  pIVar10->FrameCountEnded = iVar17;
  UpdateMouseMovingWindowEndFrame();
  iVar17 = (pIVar10->WindowsSortBuffer).Capacity;
  if (iVar17 < 0) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    iVar17 = 0;
    ppIVar12 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    ppIVar5 = (pIVar10->WindowsSortBuffer).Data;
    if (ppIVar5 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar12,ppIVar5,(long)(pIVar10->WindowsSortBuffer).Size << 3);
      ppIVar5 = (pIVar10->WindowsSortBuffer).Data;
      if ((ppIVar5 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
    }
    (pIVar10->WindowsSortBuffer).Data = ppIVar12;
    (pIVar10->WindowsSortBuffer).Capacity = 0;
  }
  (pIVar10->WindowsSortBuffer).Size = 0;
  uVar3 = (pIVar10->Windows).Size;
  uVar19 = (ulong)uVar3;
  if (iVar17 < (int)uVar3) {
    if (GImGui != (ImGuiContext *)0x0) {
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
    }
    ppIVar12 = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar19 * 8,GImAllocatorUserData);
    ppIVar5 = (pIVar10->WindowsSortBuffer).Data;
    if (ppIVar5 != (ImGuiWindow **)0x0) {
      memcpy(ppIVar12,ppIVar5,(long)(pIVar10->WindowsSortBuffer).Size << 3);
      ppIVar5 = (pIVar10->WindowsSortBuffer).Data;
      if ((ppIVar5 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar5,GImAllocatorUserData);
    }
    (pIVar10->WindowsSortBuffer).Data = ppIVar12;
    (pIVar10->WindowsSortBuffer).Capacity = uVar3;
    uVar19 = (ulong)(uint)(pIVar10->Windows).Size;
  }
  if ((int)uVar19 == 0) {
    iVar17 = 0;
  }
  else {
    uVar18 = 0;
    do {
      if ((long)(int)uVar19 <= (long)uVar18) {
LAB_0014334e:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                      ,0x4d8,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar11 = (pIVar10->Windows).Data[uVar18];
      if ((pIVar11->Active != true) || ((pIVar11->Flags & 0x1000000) == 0)) {
        AddWindowToSortBuffer(&pIVar10->WindowsSortBuffer,pIVar11);
        uVar19 = (ulong)(uint)(pIVar10->Windows).Size;
      }
      uVar18 = uVar18 + 1;
      iVar17 = (int)uVar19;
    } while (uVar18 != uVar19);
  }
  if (iVar17 == (pIVar10->WindowsSortBuffer).Size) {
    (pIVar10->Windows).Size = iVar17;
    iVar17 = (pIVar10->WindowsSortBuffer).Capacity;
    (pIVar10->WindowsSortBuffer).Capacity = (pIVar10->Windows).Capacity;
    (pIVar10->Windows).Capacity = iVar17;
    ppIVar5 = (pIVar10->WindowsSortBuffer).Data;
    (pIVar10->WindowsSortBuffer).Data = (pIVar10->Windows).Data;
    (pIVar10->Windows).Data = ppIVar5;
    (pIVar10->IO).MetricsActiveWindows = pIVar10->WindowsActiveCount;
    ((pIVar10->IO).Fonts)->Locked = false;
    (pIVar10->IO).MouseWheel = 0.0;
    (pIVar10->IO).MouseWheelH = 0.0;
    if ((pIVar10->IO).InputQueueCharacters.Capacity < 0) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (unsigned_short *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
      puVar6 = (pIVar10->IO).InputQueueCharacters.Data;
      if (puVar6 != (unsigned_short *)0x0) {
        memcpy(__dest,puVar6,(long)(pIVar10->IO).InputQueueCharacters.Size * 2);
        puVar6 = (pIVar10->IO).InputQueueCharacters.Data;
        if ((puVar6 != (unsigned_short *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(puVar6,GImAllocatorUserData);
      }
      (pIVar10->IO).InputQueueCharacters.Data = __dest;
      (pIVar10->IO).InputQueueCharacters.Capacity = 0;
    }
    (pIVar10->IO).InputQueueCharacters.Size = 0;
    (pIVar10->IO).NavInputs[0] = 0.0;
    (pIVar10->IO).NavInputs[1] = 0.0;
    (pIVar10->IO).NavInputs[2] = 0.0;
    (pIVar10->IO).NavInputs[3] = 0.0;
    (pIVar10->IO).NavInputs[4] = 0.0;
    (pIVar10->IO).NavInputs[5] = 0.0;
    (pIVar10->IO).NavInputs[6] = 0.0;
    (pIVar10->IO).NavInputs[7] = 0.0;
    (pIVar10->IO).NavInputs[8] = 0.0;
    (pIVar10->IO).NavInputs[9] = 0.0;
    (pIVar10->IO).NavInputs[10] = 0.0;
    (pIVar10->IO).NavInputs[0xb] = 0.0;
    (pIVar10->IO).NavInputs[0xc] = 0.0;
    (pIVar10->IO).NavInputs[0xd] = 0.0;
    (pIVar10->IO).NavInputs[0xe] = 0.0;
    (pIVar10->IO).NavInputs[0xf] = 0.0;
    (pIVar10->IO).NavInputs[0x10] = 0.0;
    (pIVar10->IO).NavInputs[0x11] = 0.0;
    (pIVar10->IO).NavInputs[0x12] = 0.0;
    (pIVar10->IO).NavInputs[0x13] = 0.0;
    (pIVar10->IO).NavInputs[0x14] = 0.0;
    (pIVar10->IO).NavInputs[0x15] = 0.0;
    return;
  }
  __assert_fail("g.Windows.Size == g.WindowsSortBuffer.Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                ,0x1058,"void ImGui::EndFrame()");
}

Assistant:

void ImGui::EndFrame()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    if (g.FrameCountEnded == g.FrameCount)          // Don't process EndFrame() multiple times.
        return;
    IM_ASSERT(g.FrameScopeActive && "Forgot to call ImGui::NewFrame()?");

    // Notify OS when our Input Method Editor cursor has moved (e.g. CJK inputs using Microsoft IME)
    if (g.IO.ImeSetInputScreenPosFn && (g.PlatformImeLastPos.x == FLT_MAX || ImLengthSqr(g.PlatformImeLastPos - g.PlatformImePos) > 0.0001f))
    {
        g.IO.ImeSetInputScreenPosFn((int)g.PlatformImePos.x, (int)g.PlatformImePos.y);
        g.PlatformImeLastPos = g.PlatformImePos;
    }

    // Report when there is a mismatch of Begin/BeginChild vs End/EndChild calls. Important: Remember that the Begin/BeginChild API requires you
    // to always call End/EndChild even if Begin/BeginChild returns false! (this is unfortunately inconsistent with most other Begin* API).
    if (g.CurrentWindowStack.Size != 1)
    {
        if (g.CurrentWindowStack.Size > 1)
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you forget to call End/EndChild?");
            while (g.CurrentWindowStack.Size > 1) // FIXME-ERRORHANDLING
                End();
        }
        else
        {
            IM_ASSERT(g.CurrentWindowStack.Size == 1 && "Mismatched Begin/BeginChild vs End/EndChild calls: did you call End/EndChild too much?");
        }
    }

    // Hide implicit/fallback "Debug" window if it hasn't been used
    g.FrameScopePushedImplicitWindow = false;
    if (g.CurrentWindow && !g.CurrentWindow->WriteAccessed)
        g.CurrentWindow->Active = false;
    End();

    // Show CTRL+TAB list window
    if (g.NavWindowingTarget)
        NavUpdateWindowingList();

    // Drag and Drop: Elapse payload (if delivered, or if source stops being submitted)
    if (g.DragDropActive)
    {
        bool is_delivered = g.DragDropPayload.Delivery;
        bool is_elapsed = (g.DragDropPayload.DataFrameCount + 1 < g.FrameCount) && ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceAutoExpirePayload) || !IsMouseDown(g.DragDropMouseButton));
        if (is_delivered || is_elapsed)
            ClearDragDrop();
    }

    // Drag and Drop: Fallback for source tooltip. This is not ideal but better than nothing.
    if (g.DragDropActive && g.DragDropSourceFrameCount < g.FrameCount)
    {
        g.DragDropWithinSourceOrTarget = true;
        SetTooltip("...");
        g.DragDropWithinSourceOrTarget = false;
    }

    // End frame
    g.FrameScopeActive = false;
    g.FrameCountEnded = g.FrameCount;

    // Initiate moving window + handle left-click and right-click focus
    UpdateMouseMovingWindowEndFrame();

    // Sort the window list so that all child windows are after their parent
    // We cannot do that on FocusWindow() because childs may not exist yet
    g.WindowsSortBuffer.resize(0);
    g.WindowsSortBuffer.reserve(g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Active && (window->Flags & ImGuiWindowFlags_ChildWindow))       // if a child is active its parent will add it
            continue;
        AddWindowToSortBuffer(&g.WindowsSortBuffer, window);
    }

    // This usually assert if there is a mismatch between the ImGuiWindowFlags_ChildWindow / ParentWindow values and DC.ChildWindows[] in parents, aka we've done something wrong.
    IM_ASSERT(g.Windows.Size == g.WindowsSortBuffer.Size);
    g.Windows.swap(g.WindowsSortBuffer);
    g.IO.MetricsActiveWindows = g.WindowsActiveCount;

    // Unlock font atlas
    g.IO.Fonts->Locked = false;

    // Clear Input data for next frame
    g.IO.MouseWheel = g.IO.MouseWheelH = 0.0f;
    g.IO.InputQueueCharacters.resize(0);
    memset(g.IO.NavInputs, 0, sizeof(g.IO.NavInputs));
}